

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O2

CImg<char> * __thiscall cimg_library::CImg<char>::move_to(CImg<char> *this,CImg<char> *img)

{
  if ((this->_is_shared == false) && (img->_is_shared != true)) {
    swap(this,img);
  }
  else {
    assign<char>(img,this);
  }
  assign(this);
  return img;
}

Assistant:

CImg<T>& move_to(CImg<T>& img) {
      if (_is_shared || img._is_shared) img.assign(*this);
      else swap(img);
      assign();
      return img;
    }